

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,ON_3dPoint *B,double *pivot)

{
  double **ppdVar1;
  double *pdVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double ***pppdVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int row0;
  ulong uVar12;
  ON_3dPoint *this_00;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  ON_3dPoint t;
  double local_e0;
  ON_3dPoint *local_c0;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  uVar9 = this->m_row_count;
  pppdVar7 = &this->m;
  if (uVar9 == (this->m_rowmem).m_count) {
    pppdVar7 = &(this->m_rowmem).m_a;
  }
  uVar3 = this->m_col_count;
  if ((int)uVar9 < this->m_col_count) {
    uVar3 = uVar9;
  }
  if ((int)uVar3 < 1) {
    uVar14 = 0;
    uVar15 = 0;
    uVar9 = 0;
  }
  else {
    ppdVar1 = *pppdVar7;
    local_c0 = B + 1;
    local_e0 = 0.0;
    uVar13 = 1;
    uVar10 = 0;
    do {
      onmalloc(0);
      dVar16 = ABS(ppdVar1[uVar10][uVar10]);
      uVar14 = SUB84(dVar16,0);
      uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
      uVar11 = uVar10 + 1;
      uVar9 = (uint)uVar10;
      if ((long)uVar11 < (long)this->m_row_count) {
        uVar12 = uVar10 & 0xffffffff;
        uVar8 = uVar13;
        do {
          dVar16 = ABS(ppdVar1[uVar8][uVar10]);
          if ((double)CONCAT44(uVar15,uVar14) <= dVar16 && dVar16 != (double)CONCAT44(uVar15,uVar14)
             ) {
            uVar12 = uVar8 & 0xffffffff;
          }
          if (dVar16 <= (double)CONCAT44(uVar15,uVar14)) {
            dVar16 = (double)CONCAT44(uVar15,uVar14);
          }
          uVar8 = uVar8 + 1;
          uVar14 = SUB84(dVar16,0);
          uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
        } while ((uint)this->m_row_count != uVar8);
      }
      else {
        uVar12 = uVar10 & 0xffffffff;
      }
      uVar14 = SUB84(dVar16,0);
      uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
      if ((uVar10 != 0) && (local_e0 <= dVar16)) {
        uVar14 = SUB84(local_e0,0);
        uVar15 = (undefined4)((ulong)local_e0 >> 0x20);
      }
      local_e0 = (double)CONCAT44(uVar15,uVar14);
      if (dVar16 <= zero_tolerance) break;
      row0 = (int)uVar12;
      if (uVar10 != uVar12) {
        SwapRows(this,row0,uVar9);
        dVar16 = B[row0].z;
        dVar4 = B[row0].x;
        dVar5 = B[row0].y;
        B[row0].z = B[uVar10].z;
        dVar6 = B[uVar10].y;
        B[row0].x = B[uVar10].x;
        B[row0].y = dVar6;
        B[uVar10].x = dVar4;
        B[uVar10].y = dVar5;
        B[uVar10].z = dVar16;
      }
      pdVar2 = ppdVar1[uVar10];
      dVar16 = pdVar2[uVar10];
      pdVar2[uVar10] = 1.0;
      ON_ArrayScale(this->m_col_count + ~uVar9,1.0 / dVar16,pdVar2 + uVar11,pdVar2 + uVar11);
      ON_3dPoint::operator*=(B + uVar10,1.0 / dVar16);
      uVar12 = uVar13;
      this_00 = local_c0;
      if ((long)uVar11 < (long)this->m_row_count) {
        do {
          pdVar2 = ppdVar1[uVar12];
          dVar16 = pdVar2[uVar10];
          pdVar2[uVar10] = 0.0;
          if (zero_tolerance < ABS(dVar16)) {
            dVar16 = (double)((ulong)dVar16 ^ (ulong)DAT_006a8440);
            ON_Array_aA_plus_B(this->m_col_count + ~uVar9,dVar16,ppdVar1[uVar10] + uVar11,
                               pdVar2 + uVar11,pdVar2 + uVar11);
            ::operator*(&local_60,dVar16,B + uVar10);
            ON_3dVector::ON_3dVector(&local_48,&local_60);
            ON_3dPoint::operator+=(this_00,&local_48);
          }
          uVar12 = uVar12 + 1;
          this_00 = this_00 + 1;
        } while ((int)uVar12 < this->m_row_count);
      }
      uVar13 = uVar13 + 1;
      local_c0 = local_c0 + 1;
      uVar10 = uVar11;
      uVar9 = uVar3;
    } while (uVar11 != uVar3);
  }
  if (pivot != (double *)0x0) {
    *pivot = (double)CONCAT44(uVar15,uVar14);
  }
  return uVar9;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    ON_3dPoint* B,
    double* pivot 
    )
{
  ON_3dPoint t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    //onfree( onmalloc( 1)); // 8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}